

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gazetteer.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CoreMLModels::Gazetteer::SerializeWithCachedSizes
          (Gazetteer *this,CodedOutputStream *output)

{
  bool bVar1;
  uint32 uVar2;
  int size;
  long lVar3;
  char *data;
  string *psVar4;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  Gazetteer *this_local;
  
  uVar2 = revision(this);
  if (uVar2 != 0) {
    uVar2 = revision(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(1,uVar2,output);
  }
  language_abi_cxx11_(this);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    language_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    language_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,size,SERIALIZE,"CoreML.Specification.CoreMLModels.Gazetteer.language");
    psVar4 = language_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(10,psVar4,output);
  }
  modelparameterdata_abi_cxx11_(this);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar4 = modelparameterdata_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(100,psVar4,output);
  }
  bVar1 = has_stringclasslabels(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (200,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
  }
  return;
}

Assistant:

void Gazetteer::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CoreMLModels.Gazetteer)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint32 revision = 1;
  if (this->revision() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(1, this->revision(), output);
  }

  // string language = 10;
  if (this->language().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->language().data(), this->language().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CoreMLModels.Gazetteer.language");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      10, this->language(), output);
  }

  // bytes modelParameterData = 100;
  if (this->modelparameterdata().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      100, this->modelparameterdata(), output);
  }

  // .CoreML.Specification.StringVector stringClassLabels = 200;
  if (has_stringclasslabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      200, *ClassLabels_.stringclasslabels_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CoreMLModels.Gazetteer)
}